

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type type)

{
  Index IVar1;
  allocator<char> local_11;
  Type local_10;
  
  local_10 = (Type)this;
  if ((int)this < 0) {
    if ((int)this == -0x40) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_11);
    }
    else {
      Type::GetName_abi_cxx11_(__return_storage_ptr__,&local_10);
    }
  }
  else {
    IVar1 = Type::GetIndex(&local_10);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"type[%d]",(ulong)IVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryReaderObjdumpDisassemble::BlockSigToString(Type type) const {
  if (type.IsIndex()) {
    return StringPrintf("type[%d]", type.GetIndex());
  } else if (type == Type::Void) {
    return "";
  } else {
    return type.GetName();
  }
}